

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Type __thiscall capnp::Schema::interpretType(Schema *this,Reader proto,uint location)

{
  ushort uVar1;
  short sVar2;
  Reader proto_00;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  anon_union_8_2_eba6ea51_for_Type_5 aVar7;
  byte bVar8;
  uint index;
  uint64_t uVar9;
  anon_union_2_2_d12d5221_for_Type_3 aVar10;
  PointerReader *pPVar11;
  ulong uVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Type TVar16;
  Type TVar17;
  PointerReader local_68;
  StructReader local_48;
  
  if (proto._reader.dataSize < 0x10) {
    uVar5 = 0;
LAB_0016e6b0:
    uVar3 = 0;
LAB_0016e6b4:
    uVar4 = uVar3;
    aVar10.paramIndex = 0;
LAB_0016e6b6:
    bVar8 = 0;
    uVar12 = 0;
    TVar17.field_4.schema = (RawBrandedSchema *)0x0;
    TVar17.baseType = (short)uVar5;
    TVar17.listDepth = (char)(uVar5 >> 0x10);
    TVar17.isImplicitParam = (bool)(char)(uVar5 >> 0x18);
    TVar17.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar5 >> 0x20);
    TVar17._6_2_ = (short)(uVar5 >> 0x30);
  }
  else {
    uVar1 = *proto._reader.data;
    uVar5 = (ulong)uVar1;
    if (uVar1 < 0xe) goto LAB_0016e6b0;
    switch(uVar1) {
    case 0xe:
      bVar13 = proto._reader.pointerCount == 0;
      local_68.pointer = proto._reader.pointers;
      if (bVar13) {
        local_68.pointer = (WirePointer *)0x0;
      }
      local_68.nestingLimit = 0x7fffffff;
      if (!bVar13) {
        local_68.nestingLimit = proto._reader.nestingLimit;
      }
      uVar14 = 0;
      uVar15 = 0;
      local_68.capTable._0_4_ = 0;
      local_68.capTable._4_4_ = 0;
      if (!bVar13) {
        uVar14 = proto._reader.segment._0_4_;
        uVar15 = proto._reader.segment._4_4_;
        local_68.capTable._0_4_ = proto._reader.capTable._0_4_;
        local_68.capTable._4_4_ = proto._reader.capTable._4_4_;
      }
      local_68.segment = (SegmentReader *)CONCAT44(uVar15,uVar14);
      capnp::_::PointerReader::getStruct(&local_48,&local_68,(word *)0x0);
      proto_00._reader.capTable = local_48.capTable;
      proto_00._reader.segment = local_48.segment;
      proto_00._reader.data = local_48.data;
      proto_00._reader.pointers = local_48.pointers;
      proto_00._reader.dataSize = local_48.dataSize;
      proto_00._reader.pointerCount = local_48.pointerCount;
      proto_00._reader._38_2_ = local_48._38_2_;
      proto_00._reader.nestingLimit = local_48.nestingLimit;
      proto_00._reader._44_4_ = local_48._44_4_;
      TVar17 = interpretType(this,proto_00,location);
      uVar12 = TVar17._0_8_;
      aVar10 = TVar17.field_3;
      bVar8 = TVar17.listDepth + 1;
LAB_0016e789:
      uVar12 = uVar12 & 0xffff000000000000;
      uVar4 = TVar17._0_4_;
      goto LAB_0016e6bb;
    case 0xf:
      if (proto._reader.dataSize < 0x80) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_68.segment = (SegmentReader *)getDependency(this,uVar9,location);
      pPVar11 = &local_68;
      aVar7 = (anon_union_8_2_eba6ea51_for_Type_5)asEnum((Schema *)pPVar11);
      aVar10.paramIndex = (uint16_t)pPVar11;
      uVar6 = 0xf;
      break;
    case 0x10:
      if (proto._reader.dataSize < 0x80) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_68.segment = (SegmentReader *)getDependency(this,uVar9,location);
      pPVar11 = &local_68;
      aVar7 = (anon_union_8_2_eba6ea51_for_Type_5)asStruct((Schema *)pPVar11);
      aVar10.paramIndex = (uint16_t)pPVar11;
      uVar6 = 0x10;
      break;
    case 0x11:
      if (proto._reader.dataSize < 0x80) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_68.segment = (SegmentReader *)getDependency(this,uVar9,location);
      pPVar11 = &local_68;
      aVar7 = (anon_union_8_2_eba6ea51_for_Type_5)asInterface((Schema *)pPVar11);
      aVar10.paramIndex = (uint16_t)pPVar11;
      uVar6 = 0x11;
      break;
    case 0x12:
      uVar5 = 0x12;
      if (proto._reader.dataSize < 0x50) goto LAB_0016e6b0;
      sVar2 = *(short *)((long)proto._reader.data + 8);
      if (sVar2 == 2) {
        uVar4 = 0x1000000;
        uVar3 = 0x1000000;
        if (0x5f < proto._reader.dataSize) {
          aVar10 = (anon_union_2_2_d12d5221_for_Type_3)
                   ((anon_union_2_2_d12d5221_for_Type_3 *)((long)proto._reader.data + 10))->
                   paramIndex;
          goto LAB_0016e6b6;
        }
        goto LAB_0016e6b4;
      }
      if (sVar2 == 1) {
        if (proto._reader.dataSize < 0xc0) {
          uVar9 = 0;
          index = 0;
          if (0x5f < proto._reader.dataSize) goto LAB_0016e897;
        }
        else {
          uVar9 = *(uint64_t *)((long)proto._reader.data + 0x10);
LAB_0016e897:
          index = (uint)*(ushort *)((long)proto._reader.data + 10);
        }
        TVar17 = getBrandBinding(this,uVar9,index);
        uVar12 = TVar17._0_8_;
        bVar8 = TVar17.listDepth;
        aVar10 = TVar17.field_3;
        goto LAB_0016e789;
      }
      if (sVar2 != 0) goto switchD_0016e705_default;
      if (proto._reader.dataSize < 0x60) goto LAB_0016e6b0;
      aVar10 = (anon_union_2_2_d12d5221_for_Type_3)
               ((anon_union_2_2_d12d5221_for_Type_3 *)((long)proto._reader.data + 10))->paramIndex;
      uVar4 = 0;
      goto LAB_0016e6b6;
    default:
switchD_0016e705_default:
      kj::_::unreachable();
    }
    TVar17.field_4.schema = aVar7.schema;
    TVar17.baseType = (short)uVar6;
    TVar17.listDepth = (char)((ulong)uVar6 >> 0x10);
    TVar17.isImplicitParam = (bool)(char)((ulong)uVar6 >> 0x18);
    TVar17.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar6 >> 0x20);
    TVar17._6_2_ = (short)((ulong)uVar6 >> 0x30);
    bVar8 = 0;
    uVar4 = 0;
    uVar12 = 0;
  }
LAB_0016e6bb:
  TVar16.field_4 = TVar17.field_4;
  TVar16._0_8_ = TVar17._0_8_ & 0xffff | (ulong)bVar8 << 0x10 |
                 uVar4 & 0xff000000 | uVar12 | (ulong)aVar10.paramIndex << 0x20;
  return TVar16;
}

Assistant:

Type Schema::interpretType(schema::Type::Reader proto, uint location) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return getDependency(structType.getTypeId(), location).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return getDependency(enumType.getTypeId(), location).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return getDependency(interfaceType.getTypeId(), location).asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(interpretType(proto.getList().getElementType(), location));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return anyPointer.getUnconstrained().which();
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          return Type(Type::ImplicitParameter {
              anyPointer.getImplicitMethodParameter().getParameterIndex() });
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}